

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O0

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  unsigned_short uVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  char *pcVar5;
  long in_RSI;
  long in_RDI;
  float fVar6;
  int i_4;
  float *outptr_4;
  unsigned_short *ptr_4;
  int q_4;
  int i_3;
  unsigned_short *outptr_3;
  float *ptr_3;
  int q_3;
  int i_2;
  float *outptr_2;
  char *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  unsigned_short *ptr_1;
  int q_1;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  Mat *in_stack_fffffffffffffbf8;
  int _elempack;
  size_t in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  int _w;
  Mat *this_00;
  Mat *in_stack_fffffffffffffc10;
  Allocator *in_stack_fffffffffffffc20;
  int local_35c;
  Mat local_358;
  float *local_318;
  Mat local_310;
  unsigned_short *local_2d0;
  int local_2c8;
  int local_2c4;
  Mat local_2c0;
  unsigned_short *local_280;
  Mat local_278;
  float *local_238;
  int local_230;
  int local_22c;
  Mat local_228;
  float *local_1e8;
  Mat local_1e0;
  char *local_1a0;
  int local_198;
  int local_194;
  Mat local_190;
  float *local_150;
  Mat local_148;
  unsigned_short *local_108;
  int local_100;
  int local_fc;
  Mat local_f8;
  unsigned_short *local_b8;
  Mat local_a0;
  float *local_60;
  int local_58;
  int local_54;
  long local_50;
  int local_44;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  if (*(int *)(in_RDI + 0xb8) == *(int *)(in_RDI + 0xbc)) {
    Mat::operator=(in_stack_fffffffffffffbf8,
                   (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    local_4 = 0;
  }
  else {
    local_2c = *(int *)(in_RSI + 0x2c);
    local_30 = *(int *)(in_RSI + 0x30);
    local_34 = *(int *)(in_RSI + 0x34);
    local_38 = *(int *)(in_RSI + 0x28);
    local_40 = *(long *)(in_RSI + 0x10);
    local_44 = *(int *)(in_RSI + 0x18);
    if (*(int *)(in_RDI + 0xbc) == 1) {
      local_50 = (long)(local_44 << 2);
    }
    else if (*(int *)(in_RDI + 0xbc) == 2) {
      local_50 = (long)(local_44 << 1);
    }
    else if (*(int *)(in_RDI + 0xbc) == 3) {
      local_50 = (long)local_44;
    }
    else {
      local_50 = local_40;
      if (*(int *)(in_RDI + 0xbc) == 4) {
        local_50 = (long)(local_44 << 1);
      }
    }
    _elempack = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
    _w = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    if (local_38 == 1) {
      Mat::create(in_stack_fffffffffffffc10,_w,in_stack_fffffffffffffc00,_elempack,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    }
    else if (local_38 == 2) {
      Mat::create(in_stack_fffffffffffffc10,_w,(int)in_stack_fffffffffffffc08,
                  in_stack_fffffffffffffc00,_elempack,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    }
    else if (local_38 == 3) {
      Mat::create(in_stack_fffffffffffffc10,_w,(int)in_stack_fffffffffffffc08,
                  (int)(in_stack_fffffffffffffc00 >> 0x20),(size_t)in_stack_fffffffffffffbf8,
                  in_stack_fffffffffffffbf4,in_stack_fffffffffffffc20);
    }
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_54 = local_2c * local_30 * local_44;
      if ((*(int *)(in_RDI + 0xb8) == 1) && (*(int *)(in_RDI + 0xbc) == 2)) {
        for (local_58 = 0; local_58 < local_34; local_58 = local_58 + 1) {
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pfVar3 = Mat::operator_cast_to_float_(&local_a0);
          Mat::~Mat((Mat *)0x1b2bc5);
          local_60 = pfVar3;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          puVar4 = Mat::operator_cast_to_unsigned_short_(&local_f8);
          Mat::~Mat((Mat *)0x1b2c1d);
          local_b8 = puVar4;
          for (local_fc = 0; local_fc < local_54; local_fc = local_fc + 1) {
            uVar2 = float32_to_float16(local_60[local_fc]);
            local_b8[local_fc] = uVar2;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xb8) == 2) && (*(int *)(in_RDI + 0xbc) == 1)) {
        for (local_100 = 0; local_100 < local_34; local_100 = local_100 + 1) {
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          puVar4 = Mat::operator_cast_to_unsigned_short_(&local_148);
          Mat::~Mat((Mat *)0x1b2d87);
          local_108 = puVar4;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pfVar3 = Mat::operator_cast_to_float_(&local_190);
          Mat::~Mat((Mat *)0x1b2dd6);
          local_150 = pfVar3;
          for (local_194 = 0; local_194 < local_54; local_194 = local_194 + 1) {
            fVar6 = float16_to_float32(local_108[local_194]);
            local_150[local_194] = fVar6;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xb8) == 3) && (*(int *)(in_RDI + 0xbc) == 1)) {
        for (local_198 = 0; local_198 < local_34; local_198 = local_198 + 1) {
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pcVar5 = Mat::operator_cast_to_signed_char_(&local_1e0);
          Mat::~Mat((Mat *)0x1b2f31);
          local_1a0 = pcVar5;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pfVar3 = Mat::operator_cast_to_float_(&local_228);
          Mat::~Mat((Mat *)0x1b2f7d);
          for (local_22c = 0; local_22c < local_54; local_22c = local_22c + 1) {
            pfVar3[local_22c] = (float)(int)local_1a0[local_22c];
          }
          local_1e8 = pfVar3;
        }
      }
      if ((*(int *)(in_RDI + 0xb8) == 1) && (*(int *)(in_RDI + 0xbc) == 4)) {
        for (local_230 = 0; local_230 < local_34; local_230 = local_230 + 1) {
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pfVar3 = Mat::operator_cast_to_float_(&local_278);
          Mat::~Mat((Mat *)0x1b30d7);
          local_238 = pfVar3;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          puVar4 = Mat::operator_cast_to_unsigned_short_(&local_2c0);
          Mat::~Mat((Mat *)0x1b3123);
          local_280 = puVar4;
          for (local_2c4 = 0; local_2c4 < local_54; local_2c4 = local_2c4 + 1) {
            uVar2 = float32_to_bfloat16(local_238[local_2c4]);
            local_280[local_2c4] = uVar2;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xb8) == 4) && (*(int *)(in_RDI + 0xbc) == 1)) {
        for (local_2c8 = 0; local_2c8 < local_34; local_2c8 = local_2c8 + 1) {
          this_00 = &local_310;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          puVar4 = Mat::operator_cast_to_unsigned_short_(this_00);
          Mat::~Mat((Mat *)0x1b3281);
          in_stack_fffffffffffffbf8 = &local_358;
          local_2d0 = puVar4;
          Mat::channel(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
          pfVar3 = Mat::operator_cast_to_float_(in_stack_fffffffffffffbf8);
          Mat::~Mat((Mat *)0x1b32cd);
          local_318 = pfVar3;
          for (local_35c = 0; local_35c < local_54; local_35c = local_35c + 1) {
            fVar6 = bfloat16_to_float32(local_2d0[local_35c]);
            local_318[local_35c] = fVar6;
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}